

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

void av1_loop_restoration_filter_unit
               (RestorationTileLimits *limits,RestorationUnitInfo *rui,
               RestorationStripeBoundaries *rsb,RestorationLineBuffers *rlbs,int plane_w,int plane_h
               ,int ss_x,int ss_y,int highbd,int bit_depth,uint8_t *data8,int stride,uint8_t *dst8,
               int dst_stride,int32_t *tmpbuf,int optimized_lr,aom_internal_error_info *error_info)

{
  int iVar1;
  int iVar2;
  stripe_filter_fun p_Var3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  size_t __n;
  uint8_t *puVar12;
  long lVar13;
  uint8_t *__dest;
  void *__dest_00;
  uint uVar14;
  uint uVar15;
  uint8_t *puVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uint8_t *puVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  uint8_t *puVar25;
  int iVar26;
  size_t __n_00;
  long lVar27;
  ulong uVar28;
  uint8_t *local_140;
  
  iVar1 = limits->v_end;
  iVar23 = limits->v_start;
  uVar17 = iVar1 - iVar23;
  iVar2 = limits->h_start;
  lVar18 = (long)iVar2;
  lVar11 = (long)stride;
  local_140 = data8 + lVar18 + iVar23 * lVar11;
  iVar10 = limits->h_end - iVar2;
  lVar24 = (long)dst_stride;
  __dest = dst8 + lVar18 + iVar23 * lVar24;
  if (rui->restoration_type == RESTORE_NONE) {
    if (highbd == 0) {
      if (0 < (int)uVar17) {
        uVar28 = (ulong)uVar17;
        do {
          memcpy(__dest,local_140,(long)iVar10);
          local_140 = local_140 + lVar11;
          __dest = __dest + lVar24;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
    }
    else if (0 < (int)uVar17) {
      local_140 = (uint8_t *)((long)local_140 * 2);
      __dest_00 = (void *)((long)__dest * 2);
      uVar28 = (ulong)uVar17;
      do {
        memcpy(__dest_00,local_140,(long)iVar10 * 2);
        local_140 = (uint8_t *)((long)local_140 + lVar11 * 2);
        __dest_00 = (void *)((long)__dest_00 + lVar24 * 2);
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
    }
  }
  else if (0 < (int)uVar17) {
    uVar14 = 0x40 >> ((byte)ss_y & 0x1f);
    uVar15 = 8 >> ((byte)ss_y & 0x1f);
    bVar9 = (byte)highbd;
    p_Var3 = stripe_filters[(int)((uint)(rui->restoration_type == RESTORE_SGRPROJ) + highbd * 2)];
    lVar24 = lVar18 + -4;
    __n_00 = (size_t)(iVar10 + 8 << (bVar9 & 0x1f));
    lVar20 = lVar18 + -4 + lVar11 * -3;
    lVar5 = lVar11 * -3 + lVar24;
    __n = (size_t)((limits->h_end - iVar2) + 8 << (bVar9 & 0x1f));
    lVar18 = lVar11 * 2;
    iVar23 = 0;
    do {
      iVar19 = limits->v_start + iVar23;
      uVar6 = 0;
      if (iVar19 == 0) {
        uVar6 = uVar15;
      }
      iVar22 = (iVar19 + uVar14) - uVar6;
      iVar7 = (int)(iVar19 + uVar15) / (int)uVar14;
      uVar6 = 0;
      if (iVar7 == 0) {
        uVar6 = uVar15;
      }
      iVar4 = iVar1 - iVar19;
      if ((int)(uVar14 - uVar6) < iVar1 - iVar19) {
        iVar4 = uVar14 - uVar6;
      }
      if (optimized_lr == 0) {
        uVar6 = iVar7 * 2;
        iVar7 = rsb->stripe_boundary_stride;
        if (iVar19 != 0) {
          puVar25 = data8 + iVar19 * stride + lVar20;
          puVar12 = (uint8_t *)((long)(data8 + iVar19 * stride + lVar5) * 2);
          iVar26 = -3;
          lVar27 = 0;
          do {
            iVar8 = -2;
            if (iVar26 == -1) {
              iVar8 = -1;
            }
            puVar16 = rsb->stripe_boundary_above;
            puVar21 = puVar12;
            if (highbd == 0) {
              puVar21 = puVar25;
            }
            memcpy((void *)((long)rlbs->tmp_save_above[0] + lVar27),puVar21,__n_00);
            memcpy(puVar21,puVar16 + (int)((iVar8 + uVar6 + 2) * iVar7 + iVar2 << (bVar9 & 0x1f)),
                   __n_00);
            lVar27 = lVar27 + 0x310;
            puVar25 = puVar25 + lVar11;
            puVar12 = puVar12 + lVar18;
            iVar26 = iVar26 + 1;
          } while (lVar27 != 0x930);
        }
        if (iVar22 < plane_h) {
          lVar27 = (long)((iVar4 + iVar19) * stride);
          puVar25 = data8 + lVar27 + lVar24;
          puVar12 = (uint8_t *)((long)(data8 + lVar27 + lVar24) * 2);
          lVar27 = 0;
          do {
            puVar16 = rsb->stripe_boundary_below;
            puVar21 = puVar12;
            if (highbd == 0) {
              puVar21 = puVar25;
            }
            memcpy((void *)((long)rlbs->tmp_save_below[0] + lVar27),puVar21,__n_00);
            memcpy(puVar21,puVar16 + (int)((lVar27 != 0 | uVar6) * iVar7 + iVar2 << (bVar9 & 0x1f)),
                   __n_00);
            lVar27 = lVar27 + 0x310;
            puVar25 = puVar25 + lVar11;
            puVar12 = puVar12 + lVar18;
          } while (lVar27 != 0x930);
        }
      }
      else {
        if (iVar19 != 0) {
          lVar27 = iVar19 * stride + lVar24;
          puVar12 = (uint8_t *)((long)(data8 + stride * -2 + lVar27) * 2);
          puVar25 = (uint8_t *)((long)(data8 + stride * -3 + lVar27) * 2);
          if (highbd == 0) {
            puVar12 = data8 + stride * -2 + lVar27;
            puVar25 = data8 + stride * -3 + lVar27;
          }
          memcpy(rlbs,puVar25,__n_00);
          memcpy(puVar25,puVar12,__n_00);
        }
        if (iVar22 < plane_h) {
          lVar27 = (iVar4 + iVar19) * stride + lVar24;
          puVar12 = (uint8_t *)((long)(data8 + lVar11 + lVar27) * 2);
          puVar25 = (uint8_t *)((long)(data8 + stride * 2 + lVar27) * 2);
          if (highbd == 0) {
            puVar12 = data8 + lVar11 + lVar27;
            puVar25 = data8 + stride * 2 + lVar27;
          }
          memcpy(rlbs->tmp_save_below + 2,puVar25,__n_00);
          memcpy(puVar25,puVar12,__n_00);
        }
      }
      (*p_Var3)(rui,iVar10,iVar4,0x40 >> ((byte)ss_x & 0x1f),local_140 + iVar23 * stride,stride,
                __dest + iVar23 * dst_stride,dst_stride,tmpbuf,bit_depth,error_info);
      if (optimized_lr == 0) {
        if (iVar19 != 0) {
          puVar25 = data8 + iVar19 * stride + lVar20;
          puVar12 = (uint8_t *)((long)(data8 + iVar19 * stride + lVar5) * 2);
          lVar27 = 0;
          do {
            puVar16 = puVar12;
            if (highbd == 0) {
              puVar16 = puVar25;
            }
            memcpy(puVar16,(void *)((long)rlbs->tmp_save_above[0] + lVar27),__n);
            lVar27 = lVar27 + 0x310;
            puVar25 = puVar25 + lVar11;
            puVar12 = puVar12 + lVar18;
          } while (lVar27 != 0x930);
        }
        if (iVar22 < plane_h) {
          lVar13 = (long)((iVar19 + iVar4) * stride);
          puVar25 = data8 + lVar13 + lVar24;
          lVar27 = ((long)iVar1 + 3) - (long)(iVar19 + iVar4);
          if (lVar27 < 1) {
            lVar27 = 0;
          }
          puVar12 = (uint8_t *)((long)(data8 + lVar13 + lVar24) * 2);
          lVar13 = 0;
          do {
            if (lVar27 * 0x310 - lVar13 == 0) break;
            puVar16 = puVar12;
            if (highbd == 0) {
              puVar16 = puVar25;
            }
            memcpy(puVar16,(void *)((long)rlbs->tmp_save_below[0] + lVar13),__n);
            lVar13 = lVar13 + 0x310;
            puVar25 = puVar25 + lVar11;
            puVar12 = puVar12 + lVar18;
          } while (lVar13 != 0x930);
        }
      }
      else {
        if (iVar19 != 0) {
          puVar25 = (uint8_t *)((long)(data8 + (long)(iVar19 * stride) + stride * -3 + lVar24) * 2);
          if (highbd == 0) {
            puVar25 = data8 + (long)(iVar19 * stride) + stride * -3 + lVar24;
          }
          memcpy(puVar25,rlbs,__n);
        }
        if ((iVar22 < plane_h) && (iVar19 + iVar4 <= iVar1)) {
          puVar25 = (uint8_t *)
                    ((long)(data8 + (long)((iVar19 + iVar4) * stride) + stride * 2 + lVar24) * 2);
          if (highbd == 0) {
            puVar25 = data8 + (long)((iVar19 + iVar4) * stride) + stride * 2 + lVar24;
          }
          memcpy(puVar25,rlbs->tmp_save_below + 2,__n);
        }
      }
      iVar23 = iVar23 + iVar4;
    } while (iVar23 < (int)uVar17);
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_unit(
    const RestorationTileLimits *limits, const RestorationUnitInfo *rui,
    const RestorationStripeBoundaries *rsb, RestorationLineBuffers *rlbs,
    int plane_w, int plane_h, int ss_x, int ss_y, int highbd, int bit_depth,
    uint8_t *data8, int stride, uint8_t *dst8, int dst_stride, int32_t *tmpbuf,
    int optimized_lr, struct aom_internal_error_info *error_info) {
  RestorationType unit_rtype = rui->restoration_type;

  int unit_h = limits->v_end - limits->v_start;
  int unit_w = limits->h_end - limits->h_start;
  uint8_t *data8_tl =
      data8 + limits->v_start * (ptrdiff_t)stride + limits->h_start;
  uint8_t *dst8_tl =
      dst8 + limits->v_start * (ptrdiff_t)dst_stride + limits->h_start;

  if (unit_rtype == RESTORE_NONE) {
    copy_rest_unit(unit_w, unit_h, data8_tl, stride, dst8_tl, dst_stride,
                   highbd);
    return;
  }

  const int filter_idx = 2 * highbd + (unit_rtype == RESTORE_SGRPROJ);
  assert(filter_idx < NUM_STRIPE_FILTERS);
  const stripe_filter_fun stripe_filter = stripe_filters[filter_idx];

  const int procunit_width = RESTORATION_PROC_UNIT_SIZE >> ss_x;

  // Filter the whole image one stripe at a time
  RestorationTileLimits remaining_stripes = *limits;
  int i = 0;
  while (i < unit_h) {
    int copy_above, copy_below;
    remaining_stripes.v_start = limits->v_start + i;

    get_stripe_boundary_info(&remaining_stripes, plane_w, plane_h, ss_y,
                             &copy_above, &copy_below);

    const int full_stripe_height = RESTORATION_PROC_UNIT_SIZE >> ss_y;
    const int runit_offset = RESTORATION_UNIT_OFFSET >> ss_y;

    // Work out where this stripe's boundaries are within
    // rsb->stripe_boundary_{above,below}
    const int frame_stripe =
        (remaining_stripes.v_start + runit_offset) / full_stripe_height;
    const int rsb_row = RESTORATION_CTX_VERT * frame_stripe;

    // Calculate this stripe's height, based on two rules:
    // * The topmost stripe in the frame is 8 luma pixels shorter than usual.
    // * We can't extend past the end of the current restoration unit
    const int nominal_stripe_height =
        full_stripe_height - ((frame_stripe == 0) ? runit_offset : 0);
    const int h = AOMMIN(nominal_stripe_height,
                         remaining_stripes.v_end - remaining_stripes.v_start);

    setup_processing_stripe_boundary(&remaining_stripes, rsb, rsb_row, highbd,
                                     h, data8, stride, rlbs, copy_above,
                                     copy_below, optimized_lr);

    stripe_filter(rui, unit_w, h, procunit_width, data8_tl + i * stride, stride,
                  dst8_tl + i * dst_stride, dst_stride, tmpbuf, bit_depth,
                  error_info);

    restore_processing_stripe_boundary(&remaining_stripes, rlbs, highbd, h,
                                       data8, stride, copy_above, copy_below,
                                       optimized_lr);

    i += h;
  }
}